

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceObjectArchive::DeviceObjectArchive(DeviceObjectArchive *this,CreateInfo *CI)

{
  bool bVar1;
  
  (this->m_NamedResources)._M_h._M_buckets = &(this->m_NamedResources)._M_h._M_single_bucket;
  (this->m_NamedResources)._M_h._M_bucket_count = 1;
  (this->m_NamedResources)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_NamedResources)._M_h._M_element_count = 0;
  (this->m_NamedResources)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->m_NamedResources)._M_h._M_rehash_policy._M_next_resize,0,0xc4);
  bVar1 = Deserialize(this,CI);
  if (!bVar1) {
    LogError<true,char[44]>
              (false,"DeviceObjectArchive",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x15b,(char (*) [44])"Failed to deserialize device object archive");
  }
  return;
}

Assistant:

DeviceObjectArchive::DeviceObjectArchive(const CreateInfo& CI) noexcept(false)
{
    if (!Deserialize(CI))
    {
        LOG_ERROR_AND_THROW("Failed to deserialize device object archive");
    }
}